

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O2

MontgomeryPoint * ecc_montgomery_double(MontgomeryPoint *P)

{
  MontgomeryCurve *mc;
  MontgomeryPoint *pMVar1;
  mp_int *x;
  mp_int *x_00;
  mp_int *x_01;
  mp_int *y;
  mp_int *pmVar2;
  mp_int *x_02;
  mp_int *x_03;
  mp_int *y_00;
  mp_int *y_01;
  mp_int *pmVar3;
  
  mc = P->mc;
  pMVar1 = ecc_montgomery_point_new_empty(mc);
  x = monty_sub(mc->mc,P->X,P->Z);
  x_00 = monty_add(mc->mc,P->X,P->Z);
  x_01 = monty_mul(mc->mc,x,x);
  y = monty_mul(mc->mc,x_00,x_00);
  pmVar2 = monty_mul(mc->mc,x_01,y);
  pMVar1->X = pmVar2;
  pmVar2 = monty_mul(mc->mc,P->X,P->Z);
  x_02 = monty_add(mc->mc,pmVar2,pmVar2);
  x_03 = monty_add(mc->mc,x_02,x_02);
  y_00 = monty_mul(mc->mc,x_03,mc->aplus2over4);
  y_01 = monty_add(mc->mc,x_01,y_00);
  pmVar3 = monty_mul(mc->mc,x_03,y_01);
  pMVar1->Z = pmVar3;
  mp_free(x);
  mp_free(x_00);
  mp_free(x_01);
  mp_free(y);
  mp_free(pmVar2);
  mp_free(x_02);
  mp_free(x_03);
  mp_free(y_00);
  mp_free(y_01);
  return pMVar1;
}

Assistant:

MontgomeryPoint *ecc_montgomery_double(MontgomeryPoint *P)
{
    MontgomeryCurve *mc = P->mc;
    MontgomeryPoint *D = ecc_montgomery_point_new_empty(mc);

    /*
     * To double a point in affine coordinates, in principle you can
     * use the same technique as for Weierstrass: differentiate the
     * curve equation to get the tangent line at the input point, use
     * that to get an expression for y which you substitute back into
     * the curve equation, and subtract the known two roots (in this
     * case both the same) from the x^2 coefficient of the resulting
     * cubic.
     *
     * In this case, we don't have an input y-coordinate, so you have
     * to do a bit of extra transformation to find a formula that can
     * work without it. The tangent formula is (3x^2 + 2ax + 1)/(2y),
     * and when that appears in the final formula it will be squared -
     * so we can substitute the y^2 in the denominator for the RHS of
     * the curve equation. Put together, that gives
     *
     *   x_out = (x+1)^2 (x-1)^2 / 4(x^3+ax^2+x)
     *
     * and, as usual, the code below transforms that into projective
     * form to avoid the division.
     */

    mp_int *Px_m_Pz = monty_sub(mc->mc, P->X, P->Z);
    mp_int *Px_p_Pz = monty_add(mc->mc, P->X, P->Z);
    mp_int *Px_m_Pz_2 = monty_mul(mc->mc, Px_m_Pz, Px_m_Pz);
    mp_int *Px_p_Pz_2 = monty_mul(mc->mc, Px_p_Pz, Px_p_Pz);
    D->X = monty_mul(mc->mc, Px_m_Pz_2, Px_p_Pz_2);
    mp_int *XZ = monty_mul(mc->mc, P->X, P->Z);
    mp_int *twoXZ = monty_add(mc->mc, XZ, XZ);
    mp_int *fourXZ = monty_add(mc->mc, twoXZ, twoXZ);
    mp_int *fourXZ_scaled = monty_mul(mc->mc, fourXZ, mc->aplus2over4);
    mp_int *Zpre = monty_add(mc->mc, Px_m_Pz_2, fourXZ_scaled);
    D->Z = monty_mul(mc->mc, fourXZ, Zpre);

    mp_free(Px_m_Pz);
    mp_free(Px_p_Pz);
    mp_free(Px_m_Pz_2);
    mp_free(Px_p_Pz_2);
    mp_free(XZ);
    mp_free(twoXZ);
    mp_free(fourXZ);
    mp_free(fourXZ_scaled);
    mp_free(Zpre);

    return D;
}